

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
::fastAccessDx(FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
               *this,int i)

{
  double dVar1;
  double *pdVar2;
  Fad<double> *in_RDI;
  value_type vVar3;
  value_type vVar4;
  int in_stack_ffffffffffffffcc;
  
  pdVar2 = Fad<double>::fastAccessDx(in_RDI,in_stack_ffffffffffffffcc);
  dVar1 = *pdVar2;
  vVar3 = FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
          ::val((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                 *)0x1583dce);
  vVar4 = FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
          ::fastAccessDx((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                          *)in_RDI,in_stack_ffffffffffffffcc);
  pdVar2 = Fad<double>::val((Fad<double> *)in_RDI->val_);
  return dVar1 * vVar3 + vVar4 * *pdVar2;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}